

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O0

FT_Error pcf_get_accel(FT_Stream stream,PCF_Face face,FT_ULong type)

{
  FT_Short FVar1;
  FT_Short FVar2;
  FT_Short FVar3;
  undefined4 uVar4;
  int iVar5;
  long local_50;
  long local_48;
  PCF_Accel accel;
  FT_Error error;
  FT_ULong size;
  FT_ULong format;
  FT_ULong type_local;
  PCF_Face face_local;
  FT_Stream stream_local;
  
  format = type;
  type_local = (FT_ULong)face;
  face_local = (PCF_Face)stream;
  accel._4_4_ = pcf_seek_to_table_type
                          (stream,(face->toc).tables,(face->toc).count,type,&size,
                           (FT_ULong *)&stack0xffffffffffffffd0);
  if (((accel._4_4_ == 0) &&
      (size = FT_Stream_ReadULongLE((FT_Stream)face_local,(FT_Error *)((long)&accel + 4)),
      accel._4_4_ == 0)) && (((size & 0xffffff00) == 0 || ((size & 0xffffff00) == 0x100)))) {
    if ((size & 4) == 0) {
      accel._4_4_ = FT_Stream_ReadFields((FT_Stream)face_local,pcf_accel_header,&face->accel);
    }
    else {
      accel._4_4_ = FT_Stream_ReadFields((FT_Stream)face_local,pcf_accel_msb_header,&face->accel);
    }
    if (accel._4_4_ == 0) {
      accel._4_4_ = 0;
      if ((face->accel).fontAscent < 0) {
        local_48 = -(face->accel).fontAscent;
      }
      else {
        local_48 = (face->accel).fontAscent;
      }
      if (0x7fff < local_48) {
        iVar5 = 0x7fff;
        if ((face->accel).fontAscent < 0) {
          iVar5 = -0x7fff;
        }
        (face->accel).fontAscent = (long)iVar5;
      }
      if ((face->accel).fontDescent < 0) {
        local_50 = -(face->accel).fontDescent;
      }
      else {
        local_50 = (face->accel).fontDescent;
      }
      if (0x7fff < local_50) {
        iVar5 = 0x7fff;
        if ((face->accel).fontDescent < 0) {
          iVar5 = -0x7fff;
        }
        (face->accel).fontDescent = (long)iVar5;
      }
      accel._4_4_ = pcf_get_metric((FT_Stream)face_local,size & 0xffffffff000000ff,
                                   &(face->accel).minbounds);
      if ((accel._4_4_ == 0) &&
         (accel._4_4_ = pcf_get_metric((FT_Stream)face_local,size & 0xffffffff000000ff,
                                       &(face->accel).maxbounds), accel._4_4_ == 0)) {
        if ((size & 0xffffff00) == 0x100) {
          accel._4_4_ = pcf_get_metric((FT_Stream)face_local,size & 0xffffffff000000ff,
                                       &(face->accel).ink_minbounds);
          if (accel._4_4_ == 0) {
            accel._4_4_ = pcf_get_metric((FT_Stream)face_local,size & 0xffffffff000000ff,
                                         &(face->accel).ink_maxbounds);
          }
        }
        else {
          FVar1 = (face->accel).minbounds.rightSideBearing;
          FVar2 = (face->accel).minbounds.characterWidth;
          FVar3 = (face->accel).minbounds.ascent;
          (face->accel).ink_minbounds.leftSideBearing = (face->accel).minbounds.leftSideBearing;
          (face->accel).ink_minbounds.rightSideBearing = FVar1;
          (face->accel).ink_minbounds.characterWidth = FVar2;
          (face->accel).ink_minbounds.ascent = FVar3;
          FVar1 = (face->accel).minbounds.attributes;
          uVar4 = *(undefined4 *)&(face->accel).minbounds.field_0xc;
          (face->accel).ink_minbounds.descent = (face->accel).minbounds.descent;
          (face->accel).ink_minbounds.attributes = FVar1;
          *(undefined4 *)&(face->accel).ink_minbounds.field_0xc = uVar4;
          (face->accel).ink_minbounds.bits = (face->accel).minbounds.bits;
          FVar1 = (face->accel).maxbounds.rightSideBearing;
          FVar2 = (face->accel).maxbounds.characterWidth;
          FVar3 = (face->accel).maxbounds.ascent;
          (face->accel).ink_maxbounds.leftSideBearing = (face->accel).maxbounds.leftSideBearing;
          (face->accel).ink_maxbounds.rightSideBearing = FVar1;
          (face->accel).ink_maxbounds.characterWidth = FVar2;
          (face->accel).ink_maxbounds.ascent = FVar3;
          FVar1 = (face->accel).maxbounds.attributes;
          uVar4 = *(undefined4 *)&(face->accel).maxbounds.field_0xc;
          (face->accel).ink_maxbounds.descent = (face->accel).maxbounds.descent;
          (face->accel).ink_maxbounds.attributes = FVar1;
          *(undefined4 *)&(face->accel).ink_maxbounds.field_0xc = uVar4;
          (face->accel).ink_maxbounds.bits = (face->accel).maxbounds.bits;
        }
      }
    }
  }
  return accel._4_4_;
}

Assistant:

static FT_Error
  pcf_get_accel( FT_Stream  stream,
                 PCF_Face   face,
                 FT_ULong   type )
  {
    FT_ULong   format, size;
    FT_Error   error;
    PCF_Accel  accel = &face->accel;


    error = pcf_seek_to_table_type( stream,
                                    face->toc.tables,
                                    face->toc.count,
                                    type,
                                    &format,
                                    &size );
    if ( error )
      goto Bail;

    if ( FT_READ_ULONG_LE( format ) )
      goto Bail;

    FT_TRACE4(( "pcf_get_accel%s:\n"
                "  format: 0x%lX (%s, %s)\n",
                type == PCF_BDF_ACCELERATORS ? " (getting BDF accelerators)"
                                             : "",
                format,
                PCF_BYTE_ORDER( format ) == MSBFirst ? "MSB" : "LSB",
                PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) ?
                  "accelerated" : "not accelerated" ));

    if ( !PCF_FORMAT_MATCH( format, PCF_DEFAULT_FORMAT )    &&
         !PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) )
      goto Bail;

    if ( PCF_BYTE_ORDER( format ) == MSBFirst )
    {
      if ( FT_STREAM_READ_FIELDS( pcf_accel_msb_header, accel ) )
        goto Bail;
    }
    else
    {
      if ( FT_STREAM_READ_FIELDS( pcf_accel_header, accel ) )
        goto Bail;
    }

    FT_TRACE5(( "  noOverlap=%s, constantMetrics=%s,"
                " terminalFont=%s, constantWidth=%s\n"
                "  inkInside=%s, inkMetrics=%s, drawDirection=%s\n"
                "  fontAscent=%ld, fontDescent=%ld, maxOverlap=%ld\n",
                accel->noOverlap ? "yes" : "no",
                accel->constantMetrics ? "yes" : "no",
                accel->terminalFont ? "yes" : "no",
                accel->constantWidth ? "yes" : "no",
                accel->inkInside ? "yes" : "no",
                accel->inkMetrics ? "yes" : "no",
                accel->drawDirection ? "RTL" : "LTR",
                accel->fontAscent,
                accel->fontDescent,
                accel->maxOverlap ));

    /* sanity checks */
    if ( FT_ABS( accel->fontAscent ) > 0x7FFF )
    {
      accel->fontAscent = accel->fontAscent < 0 ? -0x7FFF : 0x7FFF;
      FT_TRACE0(( "pfc_get_accel: clamping font ascent to value %d\n",
                  accel->fontAscent ));
    }
    if ( FT_ABS( accel->fontDescent ) > 0x7FFF )
    {
      accel->fontDescent = accel->fontDescent < 0 ? -0x7FFF : 0x7FFF;
      FT_TRACE0(( "pfc_get_accel: clamping font descent to value %d\n",
                  accel->fontDescent ));
    }

    FT_TRACE5(( "  minbounds:" ));
    error = pcf_get_metric( stream,
                            format & ( ~PCF_FORMAT_MASK ),
                            &(accel->minbounds) );
    if ( error )
      goto Bail;

    FT_TRACE5(( "  maxbounds:" ));
    error = pcf_get_metric( stream,
                            format & ( ~PCF_FORMAT_MASK ),
                            &(accel->maxbounds) );
    if ( error )
      goto Bail;

    if ( PCF_FORMAT_MATCH( format, PCF_ACCEL_W_INKBOUNDS ) )
    {
      FT_TRACE5(( "  ink minbounds:" ));
      error = pcf_get_metric( stream,
                              format & ( ~PCF_FORMAT_MASK ),
                              &(accel->ink_minbounds) );
      if ( error )
        goto Bail;

      FT_TRACE5(( "  ink maxbounds:" ));
      error = pcf_get_metric( stream,
                              format & ( ~PCF_FORMAT_MASK ),
                              &(accel->ink_maxbounds) );
      if ( error )
        goto Bail;
    }
    else
    {
      accel->ink_minbounds = accel->minbounds;
      accel->ink_maxbounds = accel->maxbounds;
    }

  Bail:
    return error;
  }